

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_wrapper.h
# Opt level: O3

void __thiscall
date::iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
          (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this,
          istreambuf_iterator<char,_std::char_traits<char>_> *srcIt,
          istreambuf_iterator<char,_std::char_traits<char>_> *srcEnd,value_type *cache,
          size_t *cacheSize)

{
  streambuf_type *psVar1;
  byte *pbVar2;
  value_type *pvVar3;
  size_t sVar4;
  bool bVar5;
  int_type iVar6;
  int_type iVar7;
  uint uVar8;
  
  this->m_srcIt = srcIt;
  this->m_srcEnd = srcEnd;
  this->m_cache = cache;
  this->m_cacheSize = cacheSize;
  iVar6 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(srcIt);
  iVar7 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(srcEnd);
  bVar5 = (iVar7 != -1) != (iVar6 == -1);
  this->m_position = -(ulong)bVar5;
  if (!bVar5) {
    psVar1 = srcIt->_M_sbuf;
    pbVar2 = *(byte **)(psVar1 + 0x10);
    if (pbVar2 < *(byte **)(psVar1 + 0x18)) {
      uVar8 = (uint)*pbVar2;
      *(byte **)(psVar1 + 0x10) = pbVar2 + 1;
      srcIt->_M_c = -1;
    }
    else {
      uVar8 = (**(code **)(*(long *)psVar1 + 0x50))(psVar1);
      srcIt->_M_c = -1;
      if (uVar8 == 0xffffffff) {
        if (*(byte **)(psVar1 + 0x10) < *(byte **)(psVar1 + 0x18)) {
          uVar8 = (uint)**(byte **)(psVar1 + 0x10);
        }
        else {
          uVar8 = (**(code **)(*(long *)psVar1 + 0x48))(psVar1);
        }
      }
    }
    pvVar3 = this->m_cache;
    sVar4 = *this->m_cacheSize;
    *this->m_cacheSize = sVar4 + 1;
    pvVar3[sVar4] = (value_type)uVar8;
  }
  return;
}

Assistant:

iterator_proxy(Iterator& srcIt, const Iterator& srcEnd, value_type* cache, std::size_t& cacheSize)
        : m_srcIt(srcIt)
        , m_srcEnd(srcEnd)
        , m_cache(cache)
        , m_cacheSize(cacheSize)
        , m_position((srcIt == srcEnd) ? static_cast<std::size_t>(-1) : 0)
    {
        if (m_position != static_cast<std::size_t>(-1))
            m_cache[m_cacheSize++] = *(srcIt++);
    }